

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_seq.c
# Opt level: O2

jas_seq2d_t * jas_seq2d_copy(jas_seq2d_t *x)

{
  jas_matrix_t *pjVar1;
  long lVar2;
  long lVar3;
  
  pjVar1 = jas_seq2d_create(x->xstart_,x->ystart_,x->xend_,x->yend_);
  if (pjVar1 != (jas_matrix_t *)0x0) {
    for (lVar2 = 0; lVar2 < x->numrows_; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 < x->numcols_; lVar3 = lVar3 + 1) {
        pjVar1->rows_[lVar2][lVar3] = x->rows_[lVar2][lVar3];
      }
    }
    return pjVar1;
  }
  __assert_fail("y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_seq.c"
                ,0xb1,"jas_seq2d_t *jas_seq2d_copy(jas_seq2d_t *)");
}

Assistant:

jas_seq2d_t *jas_seq2d_copy(jas_seq2d_t *x)
{
	jas_matrix_t *y;
	jas_matind_t i;
	jas_matind_t j;
	y = jas_seq2d_create(jas_seq2d_xstart(x), jas_seq2d_ystart(x),
	  jas_seq2d_xend(x), jas_seq2d_yend(x));
	assert(y);
	for (i = 0; i < x->numrows_; ++i) {
		for (j = 0; j < x->numcols_; ++j) {
			*jas_matrix_getref(y, i, j) = jas_matrix_get(x, i, j);
		}
	}
	return y;
}